

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

ArrayBuilder<unsigned_char> * __thiscall
kj::ArrayBuilder<unsigned_char>::operator=
          (ArrayBuilder<unsigned_char> *this,ArrayBuilder<unsigned_char> *other)

{
  uchar *puVar1;
  RemoveConst<unsigned_char> *pRVar2;
  uchar *puVar3;
  
  puVar1 = this->ptr;
  if (puVar1 != (uchar *)0x0) {
    pRVar2 = this->pos;
    puVar3 = this->endPtr;
    this->ptr = (uchar *)0x0;
    this->pos = (RemoveConst<unsigned_char> *)0x0;
    this->endPtr = (uchar *)0x0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,puVar1,1,(long)pRVar2 - (long)puVar1,(long)puVar3 - (long)puVar1,0);
  }
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (uchar *)0x0;
  other->pos = (RemoveConst<unsigned_char> *)0x0;
  other->endPtr = (uchar *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }